

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O0

void __thiscall HighsMipSolver::cleanupSolve(HighsMipSolver *this)

{
  uint uVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  bool bVar6;
  pointer pHVar7;
  double *pdVar8;
  pointer pvVar9;
  size_type sVar10;
  pointer pvVar11;
  pointer pvVar12;
  long lVar13;
  HighsLogOptions *pHVar14;
  undefined8 uVar15;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  char *pcVar16;
  long in_RDI;
  HighsLogOptions *log_options_;
  double dVar17;
  double dVar18;
  double dVar19;
  int in_stack_000000b4;
  HighsMipSolverData *in_stack_000000b8;
  bool timeless_log;
  array<char,_32UL> gapTolString;
  double gapTol;
  array<char,_32UL> gapValString;
  double printTol;
  array<char,_128UL> gapString;
  bool feasible_1;
  string solutionstatus;
  double rounded_lower_bound;
  bool feasible;
  bool havesolution;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  HighsMipAnalysis *in_stack_fffffffffffffcd8;
  HighsInt in_stack_fffffffffffffcfc;
  HighsTimer *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  HighsInt HVar21;
  int64_t iVar20;
  HighsMipAnalysis *in_stack_fffffffffffffd10;
  int64_t iVar22;
  HighsMipAnalysis *this_00;
  double in_stack_fffffffffffffd88;
  double in_stack_fffffffffffffd90;
  HighsLogType HVar23;
  double in_stack_fffffffffffffd98;
  HighsModelStatus model_status;
  double in_stack_fffffffffffffda0;
  double in_stack_fffffffffffffda8;
  HighsMipSolverData *in_stack_fffffffffffffdb0;
  double local_200;
  bool local_1e1;
  bool local_1b9;
  string local_190 [39];
  byte local_169;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128 [5];
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  array<char,_128UL> local_dd;
  bool local_5d;
  allocator local_49;
  string local_48 [32];
  double local_28;
  bool local_1a;
  byte local_19;
  
  HVar21 = (HighsInt)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616d2e);
  HighsMipSolverData::printDisplayLine(in_stack_000000b8,in_stack_000000b4);
  bVar6 = HighsMipAnalysis::mipTimerRunning
                    (in_stack_fffffffffffffcd8,(HighsInt)((ulong)in_stack_fffffffffffffcd0 >> 0x20))
  ;
  if (bVar6) {
    HighsMipAnalysis::mipTimerStop(in_stack_fffffffffffffd10,HVar21);
  }
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616d87);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616da3);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616dc8);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616ded);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x616e12);
  HighsMipSolverData::updatePrimalDualIntegral
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x30,0));
  model_status = (HighsModelStatus)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  HighsMipAnalysis::mipTimerStart(in_stack_fffffffffffffd10,HVar21);
  local_19 = *(double *)(in_RDI + 0x40) != INFINITY;
  if ((bool)local_19) {
    local_1b9 = false;
    if ((*(double *)(in_RDI + 0x48) <= *(double *)(*(long *)(in_RDI + 8) + 0x328)) &&
       (local_1b9 = false, *(double *)(in_RDI + 0x50) <= *(double *)(*(long *)(in_RDI + 8) + 0x328))
       ) {
      local_1b9 = *(double *)(in_RDI + 0x58) <= *(double *)(*(long *)(in_RDI + 8) + 0x328);
    }
    local_1a = local_1b9;
  }
  else {
    local_1a = false;
  }
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x616f3f);
  *(double *)(in_RDI + 0x60) = pHVar7->lower_bound;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x616f60);
  bVar6 = HighsObjectiveFunction::isIntegral(&pHVar7->objectiveFunction);
  if (bVar6) {
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x616f8c);
    dVar17 = pHVar7->lower_bound;
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x616fb1);
    dVar18 = HighsObjectiveFunction::integralScale(&pHVar7->objectiveFunction);
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x616fdd);
    dVar17 = ceil(dVar17 * dVar18 + -pHVar7->feastol);
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x617038);
    local_28 = HighsObjectiveFunction::integralScale(&pHVar7->objectiveFunction);
    local_28 = dVar17 / local_28;
    pdVar8 = std::max<double>((double *)(in_RDI + 0x60),&local_28);
    *(double *)(in_RDI + 0x60) = *pdVar8;
  }
  *(double *)(in_RDI + 0x60) =
       *(double *)(*(long *)(in_RDI + 0x10) + 0xf8) + *(double *)(in_RDI + 0x60);
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6170b7);
  *(double *)(in_RDI + 0x68) = pHVar7->upper_bound + *(double *)(*(long *)(in_RDI + 0x10) + 0xf8);
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6170e4);
  *(int64_t *)(in_RDI + 0x78) = pHVar7->num_nodes;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617103);
  *(int64_t *)(in_RDI + 0x80) = pHVar7->total_lp_iterations;
  pdVar8 = std::min<double>((double *)(in_RDI + 0x60),(double *)(in_RDI + 0x68));
  *(double *)(in_RDI + 0x60) = *pdVar8;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617146);
  *(double *)(in_RDI + 0x88) = (pHVar7->primal_dual_integral).value;
  if (*(int *)(*(long *)(in_RDI + 0x18) + 0xf0) == -1) {
    *(ulong *)(in_RDI + 0x60) = *(ulong *)(in_RDI + 0x60) ^ 0x8000000000000000;
    *(ulong *)(in_RDI + 0x68) = *(ulong *)(in_RDI + 0x68) ^ 0x8000000000000000;
  }
  if ((*(int *)(in_RDI + 0x20) == 0) || (*(int *)(in_RDI + 0x20) == 8)) {
    if (((local_1a & 1U) == 0) || ((local_19 & 1) == 0)) {
      *(undefined4 *)(in_RDI + 0x20) = 8;
    }
    else {
      *(undefined4 *)(in_RDI + 0x20) = 7;
    }
  }
  HighsMipAnalysis::mipTimerStop(in_stack_fffffffffffffd10,HVar21);
  HighsTimer::stop(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"-",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((local_19 & 1) != 0) {
    local_1e1 = false;
    if ((*(double *)(in_RDI + 0x48) <= *(double *)(*(long *)(in_RDI + 8) + 0x328)) &&
       (local_1e1 = false, *(double *)(in_RDI + 0x50) <= *(double *)(*(long *)(in_RDI + 8) + 0x328))
       ) {
      local_1e1 = *(double *)(in_RDI + 0x58) <= *(double *)(*(long *)(in_RDI + 8) + 0x328);
    }
    local_5d = local_1e1;
    pcVar16 = "infeasible";
    if (local_1e1 != false) {
      pcVar16 = "feasible";
    }
    std::__cxx11::string::operator=(local_48,pcVar16);
  }
  *(double *)(in_RDI + 0x70) = ABS(*(double *)(in_RDI + 0x68) - *(double *)(in_RDI + 0x60));
  if ((*(double *)(in_RDI + 0x68) != 0.0) || (NAN(*(double *)(in_RDI + 0x68)))) {
    if ((*(double *)(in_RDI + 0x68) != INFINITY) || (NAN(*(double *)(in_RDI + 0x68)))) {
      *(double *)(in_RDI + 0x70) =
           ABS(*(double *)(in_RDI + 0x68) - *(double *)(in_RDI + 0x60)) /
           ABS(*(double *)(in_RDI + 0x68));
    }
    else {
      *(undefined8 *)(in_RDI + 0x70) = 0x7ff0000000000000;
    }
  }
  else {
    *(ulong *)(in_RDI + 0x70) = ~-(ulong)(*(double *)(in_RDI + 0x60) == 0.0) & 0x7ff0000000000000;
  }
  memset(&local_dd,0,0x80);
  if ((*(double *)(in_RDI + 0x70) != INFINITY) || (NAN(*(double *)(in_RDI + 0x70)))) {
    local_f0 = 0.01;
    local_f8 = *(double *)(in_RDI + 0x70) * 0.1;
    pdVar8 = std::min<double>(&local_f0,&local_f8);
    local_100 = 1e-06;
    pdVar8 = std::max<double>(pdVar8,&local_100);
    local_e8 = *pdVar8;
    highsDoubleToString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_128[0] = *(double *)(*(long *)(in_RDI + 8) + 0x330);
    dVar17 = *(double *)(*(long *)(in_RDI + 8) + 0x338);
    pdVar8 = (double *)(*(long *)(in_RDI + 8) + 0x328);
    if (*pdVar8 <= dVar17 && dVar17 != *pdVar8) {
      if ((*(double *)(in_RDI + 0x68) != 0.0) || (NAN(*(double *)(in_RDI + 0x68)))) {
        local_130 = *(double *)(*(long *)(in_RDI + 8) + 0x338) / ABS(*(double *)(in_RDI + 0x68));
        pdVar8 = std::max<double>(local_128,&local_130);
        local_200 = *pdVar8;
      }
      else {
        local_200 = INFINITY;
      }
      local_128[0] = local_200;
    }
    if ((local_128[0] != 0.0) || (NAN(local_128[0]))) {
      if ((local_128[0] != INFINITY) || (NAN(local_128[0]))) {
        local_138 = 0.01;
        local_140 = local_128[0] * 0.1;
        pdVar8 = std::min<double>(&local_138,&local_140);
        local_148 = 1e-06;
        pdVar8 = std::max<double>(pdVar8,&local_148);
        local_e8 = *pdVar8;
        highsDoubleToString(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        pvVar9 = std::array<char,_128UL>::data((array<char,_128UL> *)0x6177a4);
        sVar10 = std::array<char,_128UL>::size(&local_dd);
        pvVar11 = std::array<char,_32UL>::data((array<char,_32UL> *)0x6177ce);
        pvVar12 = std::array<char,_32UL>::data((array<char,_32UL> *)0x6177e3);
        snprintf(pvVar9,sVar10,"%s%% (tolerance: %s%%)",pvVar11,pvVar12);
      }
      else {
        pvVar9 = std::array<char,_128UL>::data((array<char,_128UL> *)0x61781b);
        sVar10 = std::array<char,_128UL>::size(&local_dd);
        pvVar11 = std::array<char,_32UL>::data((array<char,_32UL> *)0x617845);
        snprintf(pvVar9,sVar10,"%s%% (tolerance: inf)",pvVar11);
      }
    }
    else {
      pvVar9 = std::array<char,_128UL>::data((array<char,_128UL> *)0x617667);
      sVar10 = std::array<char,_128UL>::size(&local_dd);
      pvVar11 = std::array<char,_32UL>::data((array<char,_32UL> *)0x617691);
      snprintf(pvVar9,sVar10,"%s%%",pvVar11);
    }
  }
  else {
    pvVar9 = std::array<char,_128UL>::data((array<char,_128UL> *)0x61748b);
    strcpy(pvVar9,"inf");
  }
  local_169 = *(byte *)(*(long *)(in_RDI + 8) + 0x1da) & 1;
  highsLogUser((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,"\nSolving report\n");
  lVar13 = std::__cxx11::string::length();
  if (lVar13 != 0) {
    pHVar14 = (HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380);
    uVar15 = std::__cxx11::string::c_str();
    highsLogUser(pHVar14,kInfo,"  Model             %s\n",uVar15);
  }
  pcVar16 = (char *)(*(long *)(in_RDI + 8) + 0x380);
  utilModelStatusToString_abi_cxx11_(model_status);
  uVar15 = std::__cxx11::string::c_str();
  _HVar23 = *(HighsLogType *)(in_RDI + 0x60);
  pHVar14 = *(HighsLogOptions **)(in_RDI + 0x68);
  pvVar9 = std::array<char,_128UL>::data((array<char,_128UL> *)0x617986);
  highsLogUser(pHVar14,_HVar23,pcVar16,1,
               "  Status            %s\n  Primal bound      %.12g\n  Dual bound        %.12g\n  Gap               %s\n"
               ,uVar15,pvVar9);
  std::__cxx11::string::~string(local_190);
  if ((local_169 & 1) == 0) {
    lVar13 = *(long *)(in_RDI + 8);
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6179fd);
    highsLogUser((HighsLogOptions *)(pHVar7->primal_dual_integral).value,
                 (HighsLogType)(lVar13 + 0x380),(char *)0x1,"  P-D integral      %.12g\n");
  }
  lVar13 = *(long *)(in_RDI + 8);
  __nbytes = std::__cxx11::string::c_str();
  highsLogUser((HighsLogOptions *)(lVar13 + 0x380),kInfo,"  Solution status   %s\n");
  bVar6 = std::operator!=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  HVar21 = (HighsInt)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  __buf = extraout_RDX;
  if (bVar6) {
    highsLogUser(*(HighsLogOptions **)(in_RDI + 0x40),*(HighsLogType *)(in_RDI + 0x48),
                 (int)*(undefined8 *)(in_RDI + 0x50),*(undefined8 *)(in_RDI + 0x58),
                 *(long *)(in_RDI + 8) + 0x380,1,
                 "                    %.12g (objective)\n                    %.12g (bound viol.)\n                    %.12g (int. viol.)\n                    %.12g (row viol.)\n"
                );
    __buf = extraout_RDX_00;
  }
  if ((local_169 & 1) == 0) {
    lVar13 = *(long *)(in_RDI + 8);
    HighsTimer::read((HighsTimer *)(in_RDI + 0x168),0,__buf,__nbytes);
    dVar17 = HighsMipAnalysis::mipTimerRead(in_stack_fffffffffffffcd8,HVar21);
    dVar18 = HighsMipAnalysis::mipTimerRead(in_stack_fffffffffffffcd8,HVar21);
    dVar19 = HighsMipAnalysis::mipTimerRead(in_stack_fffffffffffffcd8,HVar21);
    highsLogUser(log_options_,(HighsLogType)dVar17,SUB84(dVar18,0),dVar19,lVar13 + 0x380,1,
                 "  Timing            %.2f (total)\n                    %.2f (presolve)\n                    %.2f (solve)\n                    %.2f (postsolve)\n"
                );
  }
  lVar13 = *(long *)(in_RDI + 8);
  uVar1 = *(uint *)(in_RDI + 0xb8);
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c1b);
  iVar2 = pHVar7->num_nodes;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c31);
  this_00 = (HighsMipAnalysis *)pHVar7->total_repair_lp;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c47);
  iVar3 = pHVar7->total_repair_lp_feasible;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c5d);
  iVar4 = pHVar7->total_repair_lp_iterations;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c73);
  iVar22 = pHVar7->total_lp_iterations;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c89);
  iVar20 = pHVar7->sb_lp_iterations;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617c9f);
  iVar5 = pHVar7->sepa_lp_iterations;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x617cb0);
  highsLogUser((HighsLogOptions *)(lVar13 + 0x380),kInfo,
               "  Max sub-MIP depth %d\n  Nodes             %llu\n  Repair LPs        %llu (%llu feasible; %llu iterations)\n  LP iterations     %llu (total)\n                    %llu (strong br.)\n                    %llu (separation)\n                    %llu (heuristics)\n"
               ,(ulong)uVar1,iVar2,this_00,iVar3,iVar4,iVar22,iVar20,iVar5,
               pHVar7->heuristic_lp_iterations);
  if ((local_169 & 1) == 0) {
    HighsMipAnalysis::reportMipTimer(this_00);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void HighsMipSolver::cleanupSolve() {
  // Force a final logging line
  mipdata_->printDisplayLine(kSolutionSourceCleanup);
  // Stop the solve clock - which won't be running if presolve
  // determines the model status
  if (analysis_.mipTimerRunning(kMipClockSolve))
    analysis_.mipTimerStop(kMipClockSolve);

  // Need to complete the calculation of P-D integral, checking for NO
  // gap change
  mipdata_->updatePrimalDualIntegral(
      mipdata_->lower_bound, mipdata_->lower_bound, mipdata_->upper_bound,
      mipdata_->upper_bound, false);
  analysis_.mipTimerStart(kMipClockPostsolve);

  bool havesolution = solution_objective_ != kHighsInf;
  bool feasible;
  if (havesolution)
    feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
  else
    feasible = false;

  dual_bound_ = mipdata_->lower_bound;
  if (mipdata_->objectiveFunction.isIntegral()) {
    double rounded_lower_bound =
        std::ceil(mipdata_->lower_bound *
                      mipdata_->objectiveFunction.integralScale() -
                  mipdata_->feastol) /
        mipdata_->objectiveFunction.integralScale();
    dual_bound_ = std::max(dual_bound_, rounded_lower_bound);
  }
  dual_bound_ += model_->offset_;
  primal_bound_ = mipdata_->upper_bound + model_->offset_;
  node_count_ = mipdata_->num_nodes;
  total_lp_iterations_ = mipdata_->total_lp_iterations;
  dual_bound_ = std::min(dual_bound_, primal_bound_);
  primal_dual_integral_ = mipdata_->primal_dual_integral.value;

  // adjust objective sense in case of maximization problem
  if (orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound_ = -dual_bound_;
    primal_bound_ = -primal_bound_;
  }

  if (modelstatus_ == HighsModelStatus::kNotset ||
      modelstatus_ == HighsModelStatus::kInfeasible) {
    if (feasible && havesolution)
      modelstatus_ = HighsModelStatus::kOptimal;
    else
      modelstatus_ = HighsModelStatus::kInfeasible;
  }

  analysis_.mipTimerStop(kMipClockPostsolve);
  timer_.stop();

  std::string solutionstatus = "-";

  if (havesolution) {
    bool feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
    solutionstatus = feasible ? "feasible" : "infeasible";
  }

  gap_ = fabs(primal_bound_ - dual_bound_);
  if (primal_bound_ == 0.0)
    gap_ = dual_bound_ == 0.0 ? 0.0 : kHighsInf;
  else if (primal_bound_ != kHighsInf)
    gap_ = fabs(primal_bound_ - dual_bound_) / fabs(primal_bound_);
  else
    gap_ = kHighsInf;

  std::array<char, 128> gapString = {};

  if (gap_ == kHighsInf)
    std::strcpy(gapString.data(), "inf");
  else {
    double printTol = std::max(std::min(1e-2, 1e-1 * gap_), 1e-6);
    auto gapValString = highsDoubleToString(100.0 * gap_, printTol);
    double gapTol = options_mip_->mip_rel_gap;

    if (options_mip_->mip_abs_gap > options_mip_->mip_feasibility_tolerance) {
      gapTol = primal_bound_ == 0.0
                   ? kHighsInf
                   : std::max(gapTol,
                              options_mip_->mip_abs_gap / fabs(primal_bound_));
    }

    if (gapTol == 0.0)
      std::snprintf(gapString.data(), gapString.size(), "%s%%",
                    gapValString.data());
    else if (gapTol != kHighsInf) {
      printTol = std::max(std::min(1e-2, 1e-1 * gapTol), 1e-6);
      auto gapTolString = highsDoubleToString(100.0 * gapTol, printTol);
      std::snprintf(gapString.data(), gapString.size(),
                    "%s%% (tolerance: %s%%)", gapValString.data(),
                    gapTolString.data());
    } else
      std::snprintf(gapString.data(), gapString.size(), "%s%% (tolerance: inf)",
                    gapValString.data());
  }

  bool timeless_log = options_mip_->timeless_log;
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "\nSolving report\n");
  if (this->orig_model_->model_name_.length())
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Model             %s\n",
                 this->orig_model_->model_name_.c_str());
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Status            %s\n"
               "  Primal bound      %.12g\n"
               "  Dual bound        %.12g\n"
               "  Gap               %s\n",
               utilModelStatusToString(modelstatus_).c_str(), primal_bound_,
               dual_bound_, gapString.data());
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  P-D integral      %.12g\n",
                 mipdata_->primal_dual_integral.value);
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Solution status   %s\n", solutionstatus.c_str());
  if (solutionstatus != "-")
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "                    %.12g (objective)\n"
                 "                    %.12g (bound viol.)\n"
                 "                    %.12g (int. viol.)\n"
                 "                    %.12g (row viol.)\n",
                 solution_objective_, bound_violation_, integrality_violation_,
                 row_violation_);
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Timing            %.2f (total)\n"
                 "                    %.2f (presolve)\n"
                 "                    %.2f (solve)\n"
                 "                    %.2f (postsolve)\n",
                 timer_.read(), analysis_.mipTimerRead(kMipClockPresolve),
                 analysis_.mipTimerRead(kMipClockSolve),
                 analysis_.mipTimerRead(kMipClockPostsolve));
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Max sub-MIP depth %d\n"
               "  Nodes             %llu\n"
               "  Repair LPs        %llu (%llu feasible; %llu iterations)\n"
               "  LP iterations     %llu (total)\n"
               "                    %llu (strong br.)\n"
               "                    %llu (separation)\n"
               "                    %llu (heuristics)\n",
               int(max_submip_level), (long long unsigned)mipdata_->num_nodes,
               (long long unsigned)mipdata_->total_repair_lp,
               (long long unsigned)mipdata_->total_repair_lp_feasible,
               (long long unsigned)mipdata_->total_repair_lp_iterations,
               (long long unsigned)mipdata_->total_lp_iterations,
               (long long unsigned)mipdata_->sb_lp_iterations,
               (long long unsigned)mipdata_->sepa_lp_iterations,
               (long long unsigned)mipdata_->heuristic_lp_iterations);

  if (!timeless_log) analysis_.reportMipTimer();

  assert(modelstatus_ != HighsModelStatus::kNotset);
}